

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

upb_value * inttable_val(upb_inttable *t,uintptr_t key)

{
  upb_value *puVar1;
  upb_tabent *puVar2;
  undefined8 in_RDX;
  lookupkey_t key_00;
  
  if (key < t->array_size) {
    puVar1 = inttable_array_get(t,key);
    return puVar1;
  }
  key_00.str.size = in_RDX;
  key_00.num = key;
  puVar2 = findentry(&t->t,key_00,(uint)(key >> 0x20) ^ (uint)key,inteql);
  return &puVar2->val;
}

Assistant:

static upb_value* inttable_val(upb_inttable* t, uintptr_t key) {
  if (key < t->array_size) {
    return (upb_value*)inttable_array_get(t, key);
  } else {
    upb_tabent* e =
        findentry_mutable(&t->t, intkey(key), upb_inthash(key), &inteql);
    return e ? &e->val : NULL;
  }
}